

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

String * Json::Reader::normalizeEOL_abi_cxx11_(Location begin,Location end)

{
  char *pcVar1;
  char *in_RDX;
  char *in_RSI;
  String *in_RDI;
  char c;
  Location current;
  String *normalized;
  char *local_38;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_38 = in_RSI;
  while (local_38 != in_RDX) {
    pcVar1 = local_38 + 1;
    if (*local_38 == '\r') {
      if ((pcVar1 != in_RDX) && (*pcVar1 == '\n')) {
        pcVar1 = local_38 + 2;
      }
      local_38 = pcVar1;
      std::__cxx11::string::operator+=((string *)in_RDI,'\n');
    }
    else {
      std::__cxx11::string::operator+=((string *)in_RDI,*local_38);
      local_38 = pcVar1;
    }
  }
  return in_RDI;
}

Assistant:

String Reader::normalizeEOL(Reader::Location begin, Reader::Location end) {
  String normalized;
  normalized.reserve(static_cast<size_t>(end - begin));
  Reader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
        // convert dos EOL
        ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}